

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.c
# Opt level: O0

yrmcds_error
yrmcds_incr2(yrmcds *c,char *key,size_t key_len,uint64_t value,uint64_t initial,uint32_t expire,
            int quiet,uint32_t *serial)

{
  yrmcds_command cmd;
  char local_58 [8];
  char extras [20];
  uint32_t expire_local;
  uint64_t initial_local;
  uint64_t value_local;
  size_t key_len_local;
  char *key_local;
  yrmcds *c_local;
  
  if (((c == (yrmcds *)0x0) || (key == (char *)0x0)) || (key_len == 0)) {
    c_local._4_4_ = YRMCDS_BAD_ARGUMENT;
  }
  else if (c->text_mode == 0) {
    hton64(value,local_58);
    hton64(initial,extras);
    hton32(expire,extras + 8);
    cmd = YRMCDS_CMD_INCREMENT;
    if (quiet != 0) {
      cmd = YRMCDS_CMD_INCREMENTQ;
    }
    c_local._4_4_ = send_command(c,cmd,0,serial,key_len,key,0x14,local_58,0,(char *)0x0);
  }
  else {
    c_local._4_4_ = YRMCDS_NOT_IMPLEMENTED;
  }
  return c_local._4_4_;
}

Assistant:

yrmcds_error yrmcds_incr2(yrmcds* c, const char* key, size_t key_len,
                          uint64_t value, uint64_t initial, uint32_t expire,
                          int quiet, uint32_t* serial) {
    if( c == NULL || key == NULL || key_len == 0 )
        return YRMCDS_BAD_ARGUMENT;

    if( c->text_mode )
        return YRMCDS_NOT_IMPLEMENTED;

    char extras[20];
    hton64(value, extras);
    hton64(initial, &extras[8]);
    hton32(expire, &extras[16]);
    return send_command(c, quiet ? YRMCDS_CMD_INCREMENTQ : YRMCDS_CMD_INCREMENT,
                        0, serial, key_len, key,
                        sizeof(extras), extras, 0, NULL);
}